

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O1

string * to_string_abi_cxx11_(string *__return_storage_ptr__,ze_image_format_layout_t layout)

{
  long lVar1;
  uint uVar2;
  long *plVar3;
  uint uVar4;
  size_type *psVar5;
  char *pcVar6;
  ulong uVar7;
  ze_image_format_layout_t __val;
  char *pcVar8;
  uint __len;
  long *local_50 [2];
  long local_40 [2];
  
  switch(layout) {
  case ZE_IMAGE_FORMAT_LAYOUT_8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_8";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_16:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_16";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_32:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_32";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_8_8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_8_8";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_8_8_8_8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_8_8_8_8";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_16_16:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_16_16";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_16_16_16_16:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_16_16_16_16";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_32_32:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_32_32";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_32_32_32_32:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_32_32_32_32";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_10_10_10_2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_10_10_10_2";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_11_11_10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_11_11_10";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_5_6_5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_5_6_5";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_5_5_5_1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_5_5_5_1";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_4_4_4_4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_4_4_4_4";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_Y8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_Y8";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_NV12:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_NV12";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_YUYV:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_YUYV";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_VYUY:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_VYUY";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_YVYU:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_YVYU";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_UYVY:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_UYVY";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_AYUV:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_AYUV";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_P010:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_P010";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_Y410:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_Y410";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_P012:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_P012";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_Y16:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_Y16";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_P016:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_P016";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_Y216:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_Y216";
    pcVar6 = "";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_P216:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "ZE_IMAGE_FORMAT_LAYOUT_P216";
    pcVar6 = "";
    break;
  default:
    __val = -layout;
    if (0 < (int)layout) {
      __val = layout;
    }
    __len = 1;
    if (ZE_IMAGE_FORMAT_LAYOUT_10_10_10_2 < __val) {
      uVar7 = (ulong)__val;
      uVar2 = 4;
      do {
        __len = uVar2;
        uVar4 = (uint)uVar7;
        if (uVar4 < 100) {
          __len = __len - 2;
          goto LAB_00107f5a;
        }
        if (uVar4 < 1000) {
          __len = __len - 1;
          goto LAB_00107f5a;
        }
        if (uVar4 < 10000) goto LAB_00107f5a;
        uVar7 = uVar7 / 10000;
        uVar2 = __len + 4;
      } while (99999 < uVar4);
      __len = __len + 1;
    }
LAB_00107f5a:
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((int)layout >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(layout >> 0x1f) + (long)local_50[0]),__len,__val);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x10c7ae);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      lVar1 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_50[0] == local_40) {
      return __return_storage_ptr__;
    }
    operator_delete(local_50[0],local_40[0] + 1);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar8,pcVar6);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const ze_image_format_layout_t layout) {
  if (layout == ZE_IMAGE_FORMAT_LAYOUT_8) {
    return "ZE_IMAGE_FORMAT_LAYOUT_8";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_16) {
    return "ZE_IMAGE_FORMAT_LAYOUT_16";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_32) {
    return "ZE_IMAGE_FORMAT_LAYOUT_32";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_8_8) {
    return "ZE_IMAGE_FORMAT_LAYOUT_8_8";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_8_8_8_8) {
    return "ZE_IMAGE_FORMAT_LAYOUT_8_8_8_8";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_16_16) {
    return "ZE_IMAGE_FORMAT_LAYOUT_16_16";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_16_16_16_16) {
    return "ZE_IMAGE_FORMAT_LAYOUT_16_16_16_16";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_32_32) {
    return "ZE_IMAGE_FORMAT_LAYOUT_32_32";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_32_32_32_32) {
    return "ZE_IMAGE_FORMAT_LAYOUT_32_32_32_32";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_10_10_10_2) {
    return "ZE_IMAGE_FORMAT_LAYOUT_10_10_10_2";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_11_11_10) {
    return "ZE_IMAGE_FORMAT_LAYOUT_11_11_10";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_5_6_5) {
    return "ZE_IMAGE_FORMAT_LAYOUT_5_6_5";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_5_5_5_1) {
    return "ZE_IMAGE_FORMAT_LAYOUT_5_5_5_1";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_4_4_4_4) {
    return "ZE_IMAGE_FORMAT_LAYOUT_4_4_4_4";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_Y8) {
    return "ZE_IMAGE_FORMAT_LAYOUT_Y8";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_NV12) {
    return "ZE_IMAGE_FORMAT_LAYOUT_NV12";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_YUYV) {
    return "ZE_IMAGE_FORMAT_LAYOUT_YUYV";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_VYUY) {
    return "ZE_IMAGE_FORMAT_LAYOUT_VYUY";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_YVYU) {
    return "ZE_IMAGE_FORMAT_LAYOUT_YVYU";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_UYVY) {
    return "ZE_IMAGE_FORMAT_LAYOUT_UYVY";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_AYUV) {
    return "ZE_IMAGE_FORMAT_LAYOUT_AYUV";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_P010) {
    return "ZE_IMAGE_FORMAT_LAYOUT_P010";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_Y410) {
    return "ZE_IMAGE_FORMAT_LAYOUT_Y410";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_P012) {
    return "ZE_IMAGE_FORMAT_LAYOUT_P012";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_Y16) {
    return "ZE_IMAGE_FORMAT_LAYOUT_Y16";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_P016) {
    return "ZE_IMAGE_FORMAT_LAYOUT_P016";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_Y216) {
    return "ZE_IMAGE_FORMAT_LAYOUT_Y216";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_P216) {
    return "ZE_IMAGE_FORMAT_LAYOUT_P216";
  } else {
    return "Unknown ze_image_format_layout_t value: " +
           std::to_string(static_cast<int>(layout));
  }
}